

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O2

void __thiscall Camera::move_forward(Camera *this,float dist,float dir)

{
  float fVar1;
  
  fVar1 = sinf(this->m_yaw + dir);
  (this->m_position).field_0.x = fVar1 * dist + (this->m_position).field_0.x;
  fVar1 = cosf(dir + this->m_yaw);
  (this->m_position).field_2.z = fVar1 * dist + (this->m_position).field_2.z;
  return;
}

Assistant:

void Camera::move_forward(float dist, float dir) {
	m_position.x += glm::sin(m_yaw + dir) * dist;
	m_position.z += glm::cos(m_yaw + dir) * dist;
}